

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlNodePtr xmlXPathNextChildElement(xmlXPathParserContextPtr ctxt,xmlNodePtr cur)

{
  xmlElementType xVar1;
  xmlDoc *doc;
  bool bVar2;
  _xmlNode *local_20;
  xmlNodePtr cur_local;
  xmlXPathParserContextPtr ctxt_local;
  
  if ((ctxt == (xmlXPathParserContextPtr)0x0) || (ctxt->context == (xmlXPathContextPtr)0x0)) {
    return (xmlNodePtr)0x0;
  }
  if (cur != (xmlNodePtr)0x0) {
    xVar1 = cur->type;
    if (((xVar1 != XML_ELEMENT_NODE) && (5 < xVar1 - XML_TEXT_NODE)) && (xVar1 != XML_XINCLUDE_END))
    {
      return (xmlNodePtr)0x0;
    }
    if (cur->next == (_xmlNode *)0x0) {
      return (xmlNodePtr)0x0;
    }
    if (cur->next->type == XML_ELEMENT_NODE) {
      return cur->next;
    }
    local_20 = cur->next;
    do {
      local_20 = local_20->next;
      bVar2 = false;
      if (local_20 != (xmlNodePtr)0x0) {
        bVar2 = local_20->type != XML_ELEMENT_NODE;
      }
    } while (bVar2);
    return local_20;
  }
  doc = (xmlDoc *)ctxt->context->node;
  if (doc == (xmlDoc *)0x0) {
    return (xmlNodePtr)0x0;
  }
  xVar1 = doc->type;
  if ((xVar1 == XML_ELEMENT_NODE) || (xVar1 - XML_ENTITY_REF_NODE < 2)) {
LAB_00238951:
    local_20 = doc->children;
    if (local_20 == (_xmlNode *)0x0) {
      ctxt_local = (xmlXPathParserContextPtr)0x0;
    }
    else {
      ctxt_local = (xmlXPathParserContextPtr)local_20;
      if (local_20->type != XML_ELEMENT_NODE) {
        do {
          local_20 = local_20->next;
          bVar2 = false;
          if (local_20 != (_xmlNode *)0x0) {
            bVar2 = local_20->type != XML_ELEMENT_NODE;
          }
          ctxt_local = (xmlXPathParserContextPtr)local_20;
        } while (bVar2);
      }
    }
  }
  else {
    if (xVar1 != XML_DOCUMENT_NODE) {
      if (xVar1 == XML_DOCUMENT_FRAG_NODE) goto LAB_00238951;
      if (xVar1 != XML_HTML_DOCUMENT_NODE) {
        return (xmlNodePtr)0x0;
      }
    }
    ctxt_local = (xmlXPathParserContextPtr)xmlDocGetRootElement(doc);
  }
  return (xmlNodePtr)ctxt_local;
}

Assistant:

static xmlNodePtr
xmlXPathNextChildElement(xmlXPathParserContextPtr ctxt, xmlNodePtr cur) {
    if ((ctxt == NULL) || (ctxt->context == NULL)) return(NULL);
    if (cur == NULL) {
	cur = ctxt->context->node;
	if (cur == NULL) return(NULL);
	/*
	* Get the first element child.
	*/
	switch (cur->type) {
            case XML_ELEMENT_NODE:
	    case XML_DOCUMENT_FRAG_NODE:
	    case XML_ENTITY_REF_NODE: /* URGENT TODO: entify-refs as well? */
            case XML_ENTITY_NODE:
		cur = cur->children;
		if (cur != NULL) {
		    if (cur->type == XML_ELEMENT_NODE)
			return(cur);
		    do {
			cur = cur->next;
		    } while ((cur != NULL) &&
			(cur->type != XML_ELEMENT_NODE));
		    return(cur);
		}
		return(NULL);
            case XML_DOCUMENT_NODE:
            case XML_HTML_DOCUMENT_NODE:
		return(xmlDocGetRootElement((xmlDocPtr) cur));
	    default:
		return(NULL);
	}
	return(NULL);
    }
    /*
    * Get the next sibling element node.
    */
    switch (cur->type) {
	case XML_ELEMENT_NODE:
	case XML_TEXT_NODE:
	case XML_ENTITY_REF_NODE:
	case XML_ENTITY_NODE:
	case XML_CDATA_SECTION_NODE:
	case XML_PI_NODE:
	case XML_COMMENT_NODE:
	case XML_XINCLUDE_END:
	    break;
	/* case XML_DTD_NODE: */ /* URGENT TODO: DTD-node as well? */
	default:
	    return(NULL);
    }
    if (cur->next != NULL) {
	if (cur->next->type == XML_ELEMENT_NODE)
	    return(cur->next);
	cur = cur->next;
	do {
	    cur = cur->next;
	} while ((cur != NULL) && (cur->type != XML_ELEMENT_NODE));
	return(cur);
    }
    return(NULL);
}